

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

void Abc_NtkDumpBlif(Abc_Ntk_t *p)

{
  Abc_Obj_t *in_RAX;
  FILE *__stream;
  long lVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  ulong uVar4;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  
  local_38 = in_RAX;
  __stream = fopen("multi_and.blif","wb");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,".model %s\n","multi_and");
    fwrite(".inputs",7,1,__stream);
    if (0 < p->vCis->nSize) {
      uVar4 = 0;
      do {
        fprintf(__stream," i%d",uVar4);
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
      } while ((int)uVar3 < p->vCis->nSize);
    }
    fputc(10,__stream);
    fwrite(".outputs",8,1,__stream);
    if (0 < p->vCos->nSize) {
      uVar4 = 0;
      do {
        fprintf(__stream," o%d",uVar4);
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
      } while ((int)uVar3 < p->vCos->nSize);
    }
    fputc(10,__stream);
    pVVar2 = p->vCis;
    if (0 < pVVar2->nSize) {
      lVar1 = 0;
      do {
        local_38 = (Abc_Obj_t *)pVVar2->pArray[lVar1];
        (local_38->field_6).iTemp = (int)lVar1;
        lVar1 = lVar1 + 1;
        pVVar2 = p->vCis;
      } while (lVar1 < pVVar2->nSize);
    }
    pVVar2 = p->vCos;
    if (0 < pVVar2->nSize) {
      uVar4 = 0;
      do {
        local_38 = (Abc_Obj_t *)pVVar2->pArray[uVar4];
        pVVar2 = Abc_NtkNodeSupport(p,&local_38,1);
        fwrite(".names",6,1,__stream);
        if (0 < pVVar2->nSize) {
          lVar1 = 0;
          do {
            local_38 = (Abc_Obj_t *)pVVar2->pArray[lVar1];
            fprintf(__stream," i%d",(ulong)(uint)(local_38->field_6).iTemp);
            lVar1 = lVar1 + 1;
          } while (lVar1 < pVVar2->nSize);
        }
        fprintf(__stream," o%d\n",uVar4 & 0xffffffff);
        if (0 < pVVar2->nSize) {
          lVar1 = 0;
          do {
            local_38 = (Abc_Obj_t *)pVVar2->pArray[lVar1];
            fputc(0x31,__stream);
            lVar1 = lVar1 + 1;
          } while (lVar1 < pVVar2->nSize);
        }
        fwrite(" 1\n",3,1,__stream);
        if (pVVar2->pArray != (void **)0x0) {
          free(pVVar2->pArray);
        }
        free(pVVar2);
        uVar4 = uVar4 + 1;
        pVVar2 = p->vCos;
      } while ((long)uVar4 < (long)pVVar2->nSize);
    }
    fwrite(".end\n\n",6,1,__stream);
    fclose(__stream);
    return;
  }
  puts("Cannot open output file.");
  return;
}

Assistant:

void Abc_NtkDumpBlif( Abc_Ntk_t * p )
{
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    int i, k;
    pFile = fopen( "multi_and.blif", "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return;
    }
    fprintf( pFile, ".model %s\n", "multi_and" );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < Abc_NtkCiNum(p); i++ )
        fprintf( pFile, " i%d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    for ( i = 0; i < Abc_NtkCoNum(p); i++ )
        fprintf( pFile, " o%d", i );
    fprintf( pFile, "\n" );
    Abc_NtkForEachCi( p, pObj, i )
        pObj->iTemp = i;
    for ( i = 0; i < Abc_NtkCoNum(p); i++ )
    {
        pObj = Abc_NtkCo( p, i );
        vSupp = Abc_NtkNodeSupport( p, &pObj, 1 );
        fprintf( pFile, ".names" );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            fprintf( pFile, " i%d", pObj->iTemp );
        fprintf( pFile, " o%d\n", i );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            fprintf( pFile, "1" );
        fprintf( pFile, " 1\n" );
        Vec_PtrFree( vSupp );
    }
    fprintf( pFile, ".end\n\n" );
    fclose( pFile );
}